

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

int Nwk_ManPiNum(Nwk_Man_t *pNtk)

{
  Tim_Man_t *p;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  pVVar2 = pNtk->vCis;
  if (pVVar2->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      uVar3 = *(uint *)((long)pVVar2->pArray[lVar5] + 0x20);
      if ((uVar3 & 7) == 1) {
        p = *(Tim_Man_t **)(*pVVar2->pArray[lVar5] + 0x48);
        if (p == (Tim_Man_t *)0x0) {
          uVar3 = 1;
        }
        else {
          iVar1 = Tim_ManBoxForCi(p,uVar3 >> 7);
          uVar3 = (uint)(iVar1 == -1);
          pVVar2 = pNtk->vCis;
        }
      }
      else {
        uVar3 = 0;
      }
      iVar4 = iVar4 + uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar2->nSize);
  }
  return iVar4;
}

Assistant:

int Nwk_ManPiNum( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, Counter = 0;
    Nwk_ManForEachCi( pNtk, pNode, i )
        Counter += Nwk_ObjIsPi( pNode );
    return Counter;
}